

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Experiment.cpp
# Opt level: O3

double __thiscall Experiment::exp(Experiment *this,double __x)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Short k;
  pair<unsigned_int,_unsigned_int> pVar4;
  pair<unsigned_int,_unsigned_int> pVar5;
  pair<unsigned_int,_unsigned_int> pVar6;
  clock_t cVar7;
  clock_t cVar8;
  ostream *this_00;
  ostream *poVar9;
  ostream *in_RCX;
  int in_EDX;
  int iVar10;
  uint uVar11;
  ushort in_SI;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  karatsubaMultiplication kara;
  divideAndConquer dac;
  gradeSchoolMultiplication gsm;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  avr_t_kara;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  avr_t_dc;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  avr_t_sch;
  Num n1_1;
  Num n2_1;
  Num n5;
  Num n4;
  Num n3;
  Num n2;
  Num n1;
  karatsubaMultiplication local_218;
  divideAndConquer local_210;
  gradeSchoolMultiplication local_208;
  int local_200;
  int local_1fc;
  void *local_1f8;
  iterator iStack_1f0;
  pair<unsigned_int,_unsigned_int> *local_1e8;
  void *local_1d8;
  iterator iStack_1d0;
  pair<unsigned_int,_unsigned_int> *local_1c8;
  void *local_1b8;
  iterator iStack_1b0;
  pair<unsigned_int,_unsigned_int> *local_1a8;
  ostream *local_198;
  Num local_190;
  ulong local_168;
  clock_t local_160;
  clock_t local_158;
  clock_t local_150;
  Num local_148;
  Num local_120;
  Num local_f8;
  Num local_d0;
  Num local_a8;
  Num local_80;
  Num local_58;
  
  local_200 = in_EDX;
  Num::Num(&local_58);
  Num::Num(&local_80);
  Num::Num(&local_a8);
  Num::Num(&local_d0);
  Num::Num(&local_f8);
  gradeSchoolMultiplication::gradeSchoolMultiplication(&local_208);
  divideAndConquer::divideAndConquer(&local_210);
  karatsubaMultiplication::karatsubaMultiplication(&local_218);
  local_1b8 = (void *)0x0;
  iStack_1b0._M_current = (pair<unsigned_int,_unsigned_int> *)0x0;
  local_1a8 = (pair<unsigned_int,_unsigned_int> *)0x0;
  local_1c8 = (pair<unsigned_int,_unsigned_int> *)0x0;
  local_1d8 = (void *)0x0;
  iStack_1d0._M_current = (pair<unsigned_int,_unsigned_int> *)0x0;
  local_1e8 = (pair<unsigned_int,_unsigned_int> *)0x0;
  local_1f8 = (void *)0x0;
  iStack_1f0._M_current = (pair<unsigned_int,_unsigned_int> *)0x0;
  if (in_SI != 0) {
    uVar11 = 0;
    local_198 = in_RCX;
    do {
      iVar13 = 3;
      local_168 = (ulong)(uVar11 & 0xffff);
      iVar14 = 0;
      iVar10 = 0;
      iVar12 = 0;
      do {
        k = (Short)local_168;
        Num::createNumber(&local_190,&local_190,k);
        Num::createNumber(&local_148,&local_148,k);
        local_1fc = iVar12;
        local_150 = clock();
        gradeSchoolMultiplication::multiply(&local_120,&local_208,&local_190,&local_148);
        Num::operator=(&local_a8,&local_120);
        Num::~Num(&local_120);
        cVar7 = clock();
        cVar8 = clock();
        divideAndConquer::multiply(&local_120,&local_210,&local_190,&local_148);
        Num::operator=(&local_d0,&local_120);
        local_158 = cVar8;
        Num::~Num(&local_120);
        cVar8 = clock();
        local_160 = clock();
        karatsubaMultiplication::multiply(&local_120,&local_218,&local_190,&local_148);
        Num::operator=(&local_f8,&local_120);
        iVar14 = (iVar14 - (int)local_150) + (int)cVar7;
        iVar10 = (iVar10 - (int)local_158) + (int)cVar8;
        Num::~Num(&local_120);
        cVar7 = clock();
        iVar12 = (local_1fc - (int)local_160) + (int)cVar7;
        Num::~Num(&local_148);
        Num::~Num(&local_190);
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
      uVar1 = iVar14 / 3;
      uVar15 = (uint)local_168;
      if (iStack_1b0._M_current == local_1a8) {
        local_190._0_4_ = uVar15;
        local_190._4_4_ = uVar1;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::_M_realloc_insert<std::pair<unsigned_int,unsigned_int>>
                  ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)&local_1b8,iStack_1b0,(pair<unsigned_int,_unsigned_int> *)&local_190);
      }
      else {
        pVar4.second = uVar1;
        pVar4.first = uVar15;
        *iStack_1b0._M_current = pVar4;
        iStack_1b0._M_current = iStack_1b0._M_current + 1;
      }
      uVar2 = iVar10 / 3;
      if (iStack_1d0._M_current == local_1c8) {
        local_190._0_4_ = uVar15;
        local_190._4_4_ = uVar2;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::_M_realloc_insert<std::pair<unsigned_int,unsigned_int>>
                  ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)&local_1d8,iStack_1d0,(pair<unsigned_int,_unsigned_int> *)&local_190);
      }
      else {
        pVar5.second = uVar2;
        pVar5.first = uVar15;
        *iStack_1d0._M_current = pVar5;
        iStack_1d0._M_current = iStack_1d0._M_current + 1;
      }
      uVar3 = iVar12 / 3;
      local_190._4_4_ = uVar3;
      if (iStack_1f0._M_current == local_1e8) {
        local_190._0_4_ = uVar15;
        std::
        vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
        ::_M_realloc_insert<std::pair<unsigned_int,unsigned_int>>
                  ((vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>
                    *)&local_1f8,iStack_1f0,(pair<unsigned_int,_unsigned_int> *)&local_190);
      }
      else {
        pVar6.second = uVar3;
        pVar6.first = uVar15;
        *iStack_1f0._M_current = pVar6;
        iStack_1f0._M_current = iStack_1f0._M_current + 1;
        local_190._0_4_ = uVar15;
      }
      poVar9 = local_198;
      this_00 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
      std::__ostream_insert<char,std::char_traits<char>>(this_00,", ",2);
      std::ostream::operator<<((ostream *)this_00,uVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      std::ostream::operator<<((ostream *)poVar9,uVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,", ",2);
      poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,uVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n",1);
      uVar11 = uVar11 + local_200;
    } while ((ushort)uVar11 < in_SI);
    if (local_1f8 != (void *)0x0) {
      operator_delete(local_1f8,(long)local_1e8 - (long)local_1f8);
    }
  }
  if (local_1d8 != (void *)0x0) {
    operator_delete(local_1d8,(long)local_1c8 - (long)local_1d8);
  }
  if (local_1b8 != (void *)0x0) {
    operator_delete(local_1b8,(long)local_1a8 - (long)local_1b8);
  }
  karatsubaMultiplication::~karatsubaMultiplication(&local_218);
  divideAndConquer::~divideAndConquer(&local_210);
  gradeSchoolMultiplication::~gradeSchoolMultiplication(&local_208);
  Num::~Num(&local_f8);
  Num::~Num(&local_d0);
  Num::~Num(&local_a8);
  Num::~Num(&local_80);
  Num::~Num(&local_58);
  return (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
}

Assistant:

void Experiment::exp(Num::Short k, Num::Short step, std::ofstream& out)
{

    Num n1, n2,n3,n4,n5;

    gradeSchoolMultiplication gsm;
    divideAndConquer dac;
    karatsubaMultiplication kara;



    int avg_t_sch, avg_t_dc, avg_t_kara;

    std::vector  <std::pair<unsigned int,unsigned int>> avr_t_sch;
    std::vector  <std::pair<unsigned int, unsigned int>> avr_t_dc;
    std::vector  <std::pair<unsigned int, unsigned int>> avr_t_kara;


    for (Num::Short i = 0; i < k; i+=step)
    {
        avg_t_sch = 0;
        avg_t_dc = 0;
        avg_t_kara = 0;


            for (int j = 0; j <3; j++)
            {
                Num n1 = n1.createNumber(i);
                Num n2 = n2.createNumber(i);

                unsigned int start_time_sch =  clock();
                n3 = gsm.multiply(n1, n2);
                unsigned int end_time_sch = clock(); // finish time
                unsigned int search_time_sch = end_time_sch - start_time_sch; // overall time
                avg_t_sch += search_time_sch;

                unsigned int start_time_dc =  clock();
                n4 = dac.multiply(n1, n2);
                unsigned int end_time_dc = clock(); // finish time
                unsigned int search_time_dc = end_time_dc - start_time_dc; // overall time
                avg_t_dc += search_time_dc;

                unsigned int start_time_kara =  clock();
                n5 = kara.multiply(n1, n2);
                unsigned int end_time_kara = clock(); // finish time
                unsigned int search_time_kara = end_time_kara - start_time_kara; // overall time
                avg_t_kara += search_time_kara;
            }



        avr_t_sch.push_back(std::make_pair(i, avg_t_sch/3));
        avr_t_dc.push_back(std::make_pair(i, avg_t_dc/3));
        avr_t_kara.push_back(std::make_pair(i, avg_t_kara/3));

        out << i << ", " << avg_t_sch/3;
        out  << ", " << avg_t_dc/3;
        out << ", " << avg_t_kara/3<< "\n";
    }

}